

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_check_files.cpp
# Opt level: O2

map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* read_test_file(map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *__return_storage_ptr__,string *file_name)

{
  _Rb_tree_header *p_Var1;
  istream *piVar2;
  mapped_type *pmVar3;
  string rnum;
  uint32_t val;
  ifstream ifs;
  byte abStack_208 [488];
  
  std::ifstream::ifstream(&ifs,(string *)file_name,_S_in);
  if ((abStack_208[*(long *)(_ifs + -0x18)] & 5) != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,"\'",
                   file_name);
    std::operator+(&rnum,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                   "\' could not be opened for reading.");
    error(&rnum);
    std::__cxx11::string::~string((string *)&rnum);
    std::__cxx11::string::~string((string *)&val);
  }
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  val = 0;
  rnum._M_dataplus._M_p = (pointer)&rnum.field_2;
  rnum._M_string_length = 0;
  rnum.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar2 = std::operator>>((istream *)&ifs,(string *)&rnum);
    piVar2 = std::istream::_M_extract<unsigned_int>((uint *)piVar2);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    pmVar3 = std::
             map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](__return_storage_ptr__,&val);
    std::__cxx11::string::_M_assign((string *)pmVar3);
  }
  std::__cxx11::string::~string((string *)&rnum);
  std::ifstream::~ifstream(&ifs);
  return __return_storage_ptr__;
}

Assistant:

std::map<uint32_t, std::string> read_test_file(const std::string& file_name)
{
	std::ifstream ifs{ file_name };
	if (!ifs)
	{
		error("'" + file_name + "' could not be opened for reading.");
	}
	std::map<uint32_t, std::string> roman_nums;
	uint32_t val{ 0 };
	std::string rnum;
	while (ifs >> rnum >> val)
	{
		roman_nums[val] = rnum;
	}
	return roman_nums;
}